

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O3

void __thiscall cmGraphVizWriter::~cmGraphVizWriter(cmGraphVizWriter *this)

{
  ~cmGraphVizWriter(this);
  operator_delete(this,0x418);
  return;
}

Assistant:

cmGraphVizWriter::~cmGraphVizWriter()
{
  this->WriteFooter(this->GlobalFileStream);
}